

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O2

vector3 * vector3_multiplym4(vector3 *self,matrix4 *mT)

{
  vector3 vR;
  anon_union_24_3_07544b15_for_vector3_0 local_28;
  
  local_28.v[0] = 0.0;
  local_28.v[1] = 0.0;
  local_28.v[2] = 0.0;
  matrix4_multiplyv3(mT,self,(vector3 *)&local_28.field_1);
  (self->field_0).v[0] = local_28.v[0];
  (self->field_0).v[1] = local_28.v[1];
  (self->field_0).v[2] = local_28.v[2];
  return self;
}

Assistant:

HYPAPI struct vector3 *vector3_multiplym4(struct vector3 *self, const struct matrix4 *mT)
{
	struct vector3 vR;

	vector3_zero(&vR);

	matrix4_multiplyv3(mT, self, &vR);

	vector3_set(self, &vR);

	return self;
}